

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O0

void __thiscall
TidyConfigParser::toggleCheck
          (TidyConfigParser *this,string *groupName,string *checkName,CheckStatus status)

{
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  bool bVar1;
  byte bVar2;
  value<fmt::v11::context> *this_00;
  unsigned_long_long in_RDX;
  long in_RDI;
  bool found;
  optional<slang::TidyKind> kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  value<fmt::v11::context> *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffda0;
  string *str;
  TidyConfigParser *in_stack_fffffffffffffda8;
  TidyConfigParser *this_02;
  CheckStatus in_stack_fffffffffffffdd4;
  undefined8 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde4;
  TidyConfig *in_stack_fffffffffffffde8;
  undefined1 local_1e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  _Optional_payload_base<slang::TidyKind> local_19c;
  char *local_188;
  undefined8 local_180;
  string *in_stack_fffffffffffffe88;
  undefined8 local_128;
  undefined8 local_120;
  char *local_118;
  undefined8 uStack_110;
  char *local_100;
  undefined8 uStack_f8;
  undefined1 *local_f0;
  string local_e8;
  char *local_c8;
  undefined8 uStack_c0;
  char *local_b0;
  undefined8 uStack_a8;
  TidyConfigParser *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  char *local_68;
  undefined8 uStack_60;
  unsigned_long_long in_stack_ffffffffffffffb0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_ffffffffffffffb8;
  char *pcVar3;
  char *in_stack_ffffffffffffffc0;
  char *pcVar4;
  size_t in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c7d30);
  if (bVar1) {
    local_188 = "Empty check name in group {0}, you can toggle the whole group with {0}-*";
    local_180 = 0x48;
    this_02 = (TidyConfigParser *)&stack0xfffffffffffffe88;
    local_b0 = "Empty check name in group {0}, you can toggle the whole group with {0}-*";
    uStack_a8 = 0x48;
    local_c8 = "Empty check name in group {0}, you can toggle the whole group with {0}-*";
    uStack_c0 = 0x48;
    str = &local_e8;
    local_a0 = this_02;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    local_e8.field_2._M_allocated_capacity = 0xd;
    fmt.size_ = in_stack_ffffffffffffffc8;
    fmt.data_ = in_stack_ffffffffffffffc0;
    args.field_1.values_ = in_stack_ffffffffffffffb8.values_;
    args.desc_ = in_stack_ffffffffffffffb0;
    local_e8.field_2._8_8_ = str;
    ::fmt::v11::vformat_abi_cxx11_(fmt,args);
    reportWarning(this_02,str);
    std::__cxx11::string::~string(in_stack_fffffffffffffd50);
  }
  else {
    std::__cxx11::string::string(&local_1c0,in_stack_fffffffffffffd88);
    local_19c = (_Optional_payload_base<slang::TidyKind>)
                slang::tidyKindFromStr
                          ((string *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
    std::__cxx11::string::~string(in_stack_fffffffffffffd50);
    bVar1 = std::optional::operator_cast_to_bool((optional<slang::TidyKind> *)0x1c7ec0);
    if (!bVar1) {
      local_f0 = local_1e0;
      local_100 = "Group {} does not exist";
      uStack_f8 = 0x17;
      local_118 = "Group {} does not exist";
      uStack_110 = 0x17;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      local_128 = 0xd;
      fmt_00.size_ = in_stack_ffffffffffffffc8;
      fmt_00.data_ = in_stack_ffffffffffffffc0;
      args_00.field_1.values_ = in_stack_ffffffffffffffb8.values_;
      args_00.desc_ = in_stack_ffffffffffffffb0;
      local_120 = &stack0xfffffffffffffec8;
      ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_00);
      reportErrorAndExit(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      std::__cxx11::string::~string(in_stack_fffffffffffffd50);
    }
    this_00 = (value<fmt::v11::context> *)(in_RDI + 0x1f8);
    std::optional<slang::TidyKind>::value((optional<slang::TidyKind> *)in_stack_fffffffffffffd50);
    formatCheckName(in_stack_fffffffffffffe88);
    bVar2 = TidyConfig::toggleCheck
                      (in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                       (string *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
    std::__cxx11::string::~string(in_stack_fffffffffffffd50);
    if ((bVar2 & 1) == 0) {
      x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xfffffffffffffdc8;
      pcVar3 = "Check name {} does not exist in group {}";
      pcVar4 = (char *)0x28;
      local_68 = "Check name {} does not exist in group {}";
      uStack_60 = 0x28;
      this_01 = &local_98;
      pbVar5 = x;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                (this_00,x);
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                (this_00,x);
      local_78 = 0xdd;
      fmt_01.size_ = (size_t)pbVar5;
      fmt_01.data_ = pcVar4;
      args_01.field_1.values_ = (value<fmt::v11::context> *)pcVar3;
      args_01.desc_ = in_RDX;
      local_70 = this_01;
      ::fmt::v11::vformat_abi_cxx11_(fmt_01,args_01);
      reportWarning(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      std::__cxx11::string::~string(this_01);
    }
  }
  return;
}

Assistant:

void TidyConfigParser::toggleCheck(const std::string& groupName, const std::string& checkName,
                                   TidyConfig::CheckStatus status) {
    if (checkName.empty()) {
        reportWarning(fmt::format(
            "Empty check name in group {0}, you can toggle the whole group with {0}-*", groupName));
        return;
    }

    auto kind = slang::tidyKindFromStr(groupName);
    if (!kind)
        reportErrorAndExit(fmt::format("Group {} does not exist", groupName));
    bool found = config.toggleCheck(kind.value(), formatCheckName(checkName), status);

    if (!found)
        reportWarning(
            fmt::format("Check name {} does not exist in group {}", checkName, groupName));
}